

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_future.cpp
# Opt level: O1

void __thiscall Omega_h::Future<double>::Future(Future<double> *this,Read<double> *buf)

{
  int *piVar1;
  Alloc *pAVar2;
  anon_class_16_1_ba1d39d3 local_88;
  requests_type local_78;
  Write<double> local_58;
  Read<double> local_48;
  _Any_data local_30;
  code *local_20;
  
  local_48.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_48.write_.shared_alloc_.direct_ptr = (void *)0x0;
  local_58.shared_alloc_.alloc = (Alloc *)0x0;
  local_58.shared_alloc_.direct_ptr = (void *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.buf.write_.shared_alloc_.alloc = (buf->write_).shared_alloc_.alloc;
  if (((ulong)local_88.buf.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.buf.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88.buf.write_.shared_alloc_.alloc =
           (Alloc *)((local_88.buf.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_88.buf.write_.shared_alloc_.alloc)->use_count =
           (local_88.buf.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_88.buf.write_.shared_alloc_.direct_ptr = (buf->write_).shared_alloc_.direct_ptr;
  std::function<Omega_h::Read<double>(Omega_h::Write<double>)>::
  function<Omega_h::Future<double>::Future(Omega_h::Read<double>)::_lambda(Omega_h::Write<double>)_1_,void>
            ((function<Omega_h::Read<double>(Omega_h::Write<double>)> *)local_30._M_pod_data,
             &local_88);
  Future(this,&local_48,&local_58,&local_78,(callback_type *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  pAVar2 = local_88.buf.write_.shared_alloc_.alloc;
  if (((ulong)local_88.buf.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.buf.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_88.buf.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.buf.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pAVar2 = local_58.shared_alloc_.alloc;
  if (((ulong)local_58.shared_alloc_.alloc & 7) == 0 && local_58.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_58.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_58.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_48.write_.shared_alloc_.alloc;
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_48.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_48.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  this->status_ = completed;
  return;
}

Assistant:

Future<T>::Future(Read<T> buf)
    : Future({} /* sendbuf */, {} /* recvbuf */, {} /* request */,
          [buf](recvbuf_type) { return buf; }) {
  status_ = Status::completed;
}